

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::StickyAdapter::makeSticky
          (StickyAdapter *this,RealType w0,RealType v0,RealType v0p,RealType rl,RealType ru,
          RealType rlp,RealType rup,bool isPower)

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_78 [32];
  RealType local_58;
  RealType local_50;
  RealType local_48;
  RealType local_40;
  RealType local_38;
  RealType local_30;
  RealType local_28;
  ulong local_20;
  
  bVar1 = isSticky(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)StickyTypeID_abi_cxx11_);
  }
  local_20 = (ulong)isPower;
  this_00 = this->at_;
  local_58 = w0;
  local_50 = v0;
  local_48 = v0p;
  local_40 = rl;
  local_38 = ru;
  local_30 = rlp;
  local_28 = rup;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>,std::__cxx11::string_const&,OpenMD::StickyAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (StickyAtypeParameters *)StickyTypeID_abi_cxx11_);
  local_78._16_8_ = local_78._0_8_;
  local_78._24_8_ = local_78._8_8_;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_78 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  return;
}

Assistant:

void StickyAdapter::makeSticky(RealType w0, RealType v0, RealType v0p,
                                 RealType rl, RealType ru, RealType rlp,
                                 RealType rup, bool isPower) {
    if (isSticky()) { at_->removeProperty(StickyTypeID); }

    StickyAtypeParameters stickyParam {};
    stickyParam.w0      = w0;
    stickyParam.v0      = v0;
    stickyParam.v0p     = v0p;
    stickyParam.rl      = rl;
    stickyParam.ru      = ru;
    stickyParam.rlp     = rlp;
    stickyParam.rup     = rup;
    stickyParam.isPower = isPower;

    at_->addProperty(
        std::make_shared<StickyAtypeData>(StickyTypeID, stickyParam));
  }